

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O1

void __thiscall
despot::MemoryPool<despot::PocmanState>::NewChunk(MemoryPool<despot::PocmanState> *this)

{
  pointer *pppCVar1;
  iterator __position;
  State *this_00;
  long lVar2;
  Chunk *chunk;
  State *local_48;
  State *local_40;
  PocmanState *local_38;
  
  this_00 = (State *)operator_new(0x8800);
  lVar2 = 0;
  local_40 = this_00;
  do {
    despot::State::State(this_00);
    *(undefined ***)this_00 = &PTR__PocmanState_00113af8;
    despot::Coord::Coord((Coord *)(this_00 + 0x20));
    *(undefined8 *)(this_00 + 0x68) = 0;
    *(undefined4 *)(this_00 + 0x70) = 0;
    *(undefined8 *)(this_00 + 0x78) = 0;
    *(undefined8 *)(this_00 + 0x28) = 0;
    *(undefined8 *)(this_00 + 0x30) = 0;
    *(undefined8 *)(this_00 + 0x38) = 0;
    *(undefined8 *)(this_00 + 0x40) = 0;
    *(undefined8 *)(this_00 + 0x48) = 0;
    *(undefined8 *)(this_00 + 0x50) = 0;
    *(undefined8 *)(this_00 + 0x54) = 0;
    *(undefined8 *)(this_00 + 0x5c) = 0;
    lVar2 = lVar2 + -0x88;
    this_00 = this_00 + 0x88;
  } while (lVar2 != -0x8800);
  local_48 = local_40;
  __position._M_current =
       (this->chunks_).
       super__Vector_base<despot::MemoryPool<despot::PocmanState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::PocmanState>::Chunk_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->chunks_).
      super__Vector_base<despot::MemoryPool<despot::PocmanState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::PocmanState>::Chunk_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<despot::MemoryPool<despot::PocmanState>::Chunk*,std::allocator<despot::MemoryPool<despot::PocmanState>::Chunk*>>
    ::_M_realloc_insert<despot::MemoryPool<despot::PocmanState>::Chunk*const&>
              ((vector<despot::MemoryPool<despot::PocmanState>::Chunk*,std::allocator<despot::MemoryPool<despot::PocmanState>::Chunk*>>
                *)this,__position,(Chunk **)&local_48);
  }
  else {
    *__position._M_current = (Chunk *)local_40;
    pppCVar1 = &(this->chunks_).
                super__Vector_base<despot::MemoryPool<despot::PocmanState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::PocmanState>::Chunk_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppCVar1 = *pppCVar1 + 1;
  }
  lVar2 = 0x8778;
  do {
    local_38 = (PocmanState *)(local_48 + lVar2);
    std::vector<despot::PocmanState*,std::allocator<despot::PocmanState*>>::
    emplace_back<despot::PocmanState*>
              ((vector<despot::PocmanState*,std::allocator<despot::PocmanState*>> *)&this->freelist_
               ,&local_38);
    local_48[lVar2 + 8] = (State)0x0;
    lVar2 = lVar2 + -0x88;
  } while (lVar2 != -0x88);
  return;
}

Assistant:

void NewChunk() {
		Chunk* chunk = new Chunk;
		chunks_.push_back(chunk);
		for (int i = Chunk::Size - 1; i >= 0; --i) {
			freelist_.push_back(&chunk->Objects[i]);
			chunk->Objects[i].ClearAllocated();
		}
	}